

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O3

int __thiscall fmt::v7::system_error::init(system_error *this,EVP_PKEY_CTX *ctx)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  size_t *psVar2;
  string_view message;
  int iVar3;
  int extraout_EAX;
  int extraout_EAX_00;
  char *in_RCX;
  detail *in_RDX;
  size_t in_R8;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  in_R9;
  string_view format_str;
  format_args args;
  undefined1 local_278 [8];
  memory_buffer buffer;
  string local_50;
  
  this->error_code_ = (int)ctx;
  psVar2 = &buffer.super_buffer<char>.capacity_;
  buffer.super_buffer<char>.ptr_ = (char *)0x0;
  local_278 = (undefined1  [8])&PTR_grow_002d4bd0;
  buffer.super_buffer<char>.size_ = 500;
  format_str.size_ = in_R8;
  format_str.data_ = in_RCX;
  args.
  super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  .field_1.values_ = in_R9.values_;
  args.
  super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  .desc_ = (unsigned_long_long)in_R9;
  buffer.super_buffer<char>._vptr_buffer = (_func_int **)psVar2;
  detail::vformat_abi_cxx11_(&local_50,in_RDX,format_str,args);
  paVar1 = &local_50.field_2;
  message.size_ = local_50._M_string_length;
  message.data_ = local_50._M_dataplus._M_p;
  format_system_error((buffer<char> *)local_278,(int)ctx,message);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar1) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  local_50._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_50,buffer.super_buffer<char>._vptr_buffer,
             buffer.super_buffer<char>.ptr_ + (long)buffer.super_buffer<char>._vptr_buffer);
  std::runtime_error::runtime_error((runtime_error *)(buffer.store_ + 0x1f0),(string *)&local_50);
  std::runtime_error::operator=(&this->super_runtime_error,(runtime_error *)(buffer.store_ + 0x1f0))
  ;
  iVar3 = std::runtime_error::~runtime_error((runtime_error *)(buffer.store_ + 0x1f0));
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar1) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    iVar3 = extraout_EAX;
  }
  local_278 = (undefined1  [8])&PTR_grow_002d4bd0;
  if (buffer.super_buffer<char>._vptr_buffer != (_func_int **)psVar2) {
    operator_delete(buffer.super_buffer<char>._vptr_buffer,buffer.super_buffer<char>.size_);
    iVar3 = extraout_EAX_00;
  }
  return iVar3;
}

Assistant:

FMT_FUNC void system_error::init(int err_code, string_view format_str,
                                 format_args args) {
  error_code_ = err_code;
  memory_buffer buffer;
  format_system_error(buffer, err_code, vformat(format_str, args));
  std::runtime_error& base = *this;
  base = std::runtime_error(to_string(buffer));
}